

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O0

auto_ptr<cmCompiledGeneratorExpression> __thiscall
cmGeneratorExpression::Parse(cmGeneratorExpression *this,char *input)

{
  char *in_RDX;
  char *local_88;
  allocator local_51;
  string local_50 [32];
  undefined1 local_30 [24];
  char *input_local;
  cmGeneratorExpression *this_local;
  
  local_88 = in_RDX;
  if (in_RDX == (char *)0x0) {
    local_88 = "";
  }
  input_local = input;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,local_88,&local_51);
  Parse((cmGeneratorExpression *)local_30,(string *)input);
  local_30._8_8_ = cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)local_30);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)this,
             (auto_ptr_ref<cmCompiledGeneratorExpression>)local_30._8_8_);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return (auto_ptr<cmCompiledGeneratorExpression>)(cmCompiledGeneratorExpression *)this;
}

Assistant:

cmsys::auto_ptr<cmCompiledGeneratorExpression>
cmGeneratorExpression::Parse(const char* input)
{
  return this->Parse(std::string(input ? input : ""));
}